

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void ccp_length_op(ccp_context *ctx,void *blk,int len,unsigned_long seq)

{
  uchar local_30 [4];
  undefined1 auStack_2c [4];
  uchar iv [8];
  unsigned_long seq_local;
  int len_local;
  void *blk_local;
  ccp_context *ctx_local;
  
  iv = (uchar  [8])seq;
  PUT_32BIT_LSB_FIRST(local_30,0);
  PUT_32BIT_LSB_FIRST(auStack_2c,iv._0_4_);
  chacha20_iv(&ctx->a_cipher,local_30);
  chacha20_iv(&ctx->b_cipher,local_30);
  (ctx->b_cipher).state[0xc] = (ctx->b_cipher).state[0xc] + 1;
  smemclr(local_30,8);
  return;
}

Assistant:

static void ccp_length_op(struct ccp_context *ctx, void *blk, int len,
                          unsigned long seq)
{
    unsigned char iv[8];
    /*
     * According to RFC 4253 (section 6.4), the packet sequence number wraps
     * at 2^32, so its 32 high-order bits will always be zero.
     */
    PUT_32BIT_LSB_FIRST(iv, 0);
    PUT_32BIT_LSB_FIRST(iv + 4, seq);
    chacha20_iv(&ctx->a_cipher, iv);
    chacha20_iv(&ctx->b_cipher, iv);
    /* Reset content block count to 1, as the first is the key for Poly1305 */
    ++ctx->b_cipher.state[12];
    smemclr(iv, sizeof(iv));
}